

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O0

void brngHMACStepR(void *buf,size_t count,void *state)

{
  size_t count_00;
  octet *mac;
  size_t sVar1;
  octet *buf_00;
  long in_RDX;
  ulong in_RSI;
  brng_hmac_st *s;
  void *in_stack_ffffffffffffffa8;
  octet *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  ulong local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDX + 0x90) != 0) {
    if (in_RSI <= *(ulong *)(in_RDX + 0x90)) {
      memCopy(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x14ffe0);
      *(ulong *)(in_RDX + 0x90) = *(long *)(in_RDX + 0x90) - in_RSI;
      return;
    }
    memCopy(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x150034);
    local_10 = in_RSI - *(long *)(in_RDX + 0x90);
    *(undefined8 *)(in_RDX + 0x90) = 0;
  }
  for (; 0x1f < local_10; local_10 = local_10 - 0x20) {
    beltHMAC_keep();
    beltHMAC_keep();
    memCopy(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x1500d1);
    beltHMACStepA(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    beltHMACStepG(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    beltHMACStepA(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    beltHMACStepG(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  if (local_10 != 0) {
    count_00 = in_RDX + 0x98;
    mac = (octet *)(in_RDX + 0x98);
    sVar1 = beltHMAC_keep();
    buf_00 = mac + sVar1;
    beltHMAC_keep();
    memCopy(mac,in_stack_ffffffffffffffa8,0x1501bf);
    beltHMACStepA(buf_00,count_00,mac);
    beltHMACStepG(mac,in_stack_ffffffffffffffa8);
    beltHMACStepA(buf_00,count_00,mac);
    beltHMACStepG(mac,in_stack_ffffffffffffffa8);
    memCopy(mac,in_stack_ffffffffffffffa8,0x15024c);
    *(ulong *)(in_RDX + 0x90) = 0x20 - local_10;
  }
  return;
}

Assistant:

void brngHMACStepR(void* buf, size_t count, void* state)
{
	brng_hmac_st* s = (brng_hmac_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngHMAC_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// r <- beltHMAC(key, r) 
		memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
		beltHMACStepA(s->r, 32, s->state_ex);
		beltHMACStepG(s->r, s->state_ex);
		// Y_t <- beltHMAC(key, r || iv)
		beltHMACStepA(s->iv, s->iv_len, s->state_ex);
		beltHMACStepG(buf, s->state_ex);
		// next
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// r <- beltHMAC(key, r) 
		memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
		beltHMACStepA(s->r, 32, s->state_ex);
		beltHMACStepG(s->r, s->state_ex);
		// Y_t <- left(beltHMAC(key, r || iv))
		beltHMACStepA(s->iv, s->iv_len, s->state_ex);
		beltHMACStepG(s->block, s->state_ex);
		memCopy(buf, s->block, count);
		// next
		s->reserved = 32 - count;
	}
}